

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

bool_t gf2Tr(word *a,qr_o *f,void *stack)

{
  size_t n;
  bool_t bVar1;
  long lVar2;
  
  n = f->n;
  lVar2 = *f->params;
  wwCopy((word *)stack,a,n);
  while (lVar2 = lVar2 + -1, lVar2 != 0) {
    (*f->sqr)((word *)stack,(word *)stack,f,(void *)((long)stack + n * 8));
    wwXor2((word *)stack,a,f->n);
  }
  bVar1 = wwIsZero((word *)stack,f->n);
  return (bool_t)(bVar1 == 0);
}

Assistant:

bool_t gf2Tr(const word a[], const qr_o* f, void* stack)
{
	size_t m = gf2Deg(f);
	word* t = (word*)stack;
	stack = t + f->n;
	// pre
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	// t <- sum_{i = 0}^{m - 1} a^{2^i}
	qrCopy(t, a, f);
	while (--m)
	{
		qrSqr(t, t, f, stack);
		gf2Add2(t, a, f);
	}
	// t == 0?
	if (qrIsZero(t, f))
		return FALSE;
	// t == 1?
	ASSERT(qrIsUnity(t, f));
	return TRUE;
}